

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O1

void m256v_L_mult_inplace(m256v *LU,m256v *X_inout)

{
  bool bVar1;
  long lVar2;
  uint r1;
  ulong uVar3;
  ulong uVar4;
  int rt;
  ulong uVar5;
  ulong uVar6;
  uint local_3c;
  
  uVar5 = (ulong)LU->n_row;
  if (0 < (long)uVar5) {
    local_3c = LU->n_row - 2;
    uVar6 = uVar5;
    do {
      uVar5 = uVar5 - 1;
      rt = (int)(uVar6 - 1);
      if ((long)LU->n_col < (long)uVar6) {
        if (0 < X_inout->n_col) {
          lVar2 = 0;
          do {
            X_inout->e[lVar2 + X_inout->rstride * uVar5] = '\0';
            lVar2 = lVar2 + 1;
          } while (lVar2 < X_inout->n_col);
        }
        lVar2 = (long)LU->n_col;
        if (0 < (long)LU->n_col) {
          do {
            m256v_multadd_row_from
                      (X_inout,(int)(lVar2 + -1),0,LU->e[lVar2 + -1 + LU->rstride * uVar5],X_inout,
                       rt);
            bVar1 = 1 < lVar2;
            lVar2 = lVar2 + -1;
          } while (bVar1);
        }
      }
      else if (1 < (long)uVar6) {
        uVar4 = (ulong)local_3c;
        uVar3 = uVar5 & 0xffffffff;
        do {
          r1 = (int)uVar3 - 1;
          uVar3 = (ulong)r1;
          m256v_multadd_row_from(X_inout,r1,0,LU->e[uVar4 + LU->rstride * uVar5],X_inout,rt);
          uVar4 = uVar4 - 1;
        } while (0 < (int)r1);
      }
      local_3c = local_3c - 1;
      bVar1 = 1 < (long)uVar6;
      uVar6 = uVar6 - 1;
    } while (bVar1);
  }
  return;
}

Assistant:

void MV_GEN_N(_L_mult_inplace)(const MV_GEN_TYPE* LU, MV_GEN_TYPE* X_inout)
{
	for (int i = LU->n_row - 1; i >= 0; --i) {
		if (i >= LU->n_col) {
			/* We're in the rectangle below the triangular part
			 */
			MV_GEN_N(_clear_row)(X_inout /* Y */, i);
			for (int j = LU->n_col - 1; j >= 0; --j) {
				MV_GEN_N(_multadd_row)(X_inout, j,
						MV_GEN_N(_get_el)(LU, i, j),
						X_inout, i);
			}
		} else {
			/* i < LU->n_col, we're in the triangular part */
			for (int j = i - 1; j >= 0; --j) {
				MV_GEN_N(_multadd_row)(X_inout, j,
						MV_GEN_N(_get_el)(LU, i, j),
						X_inout, i);
			}
		}
	}
}